

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool util::compareString(char *str1,char *str2)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  
  sVar4 = strlen(str1);
  sVar5 = strlen(str2);
  if (sVar4 == sVar5) {
    bVar7 = sVar4 == 0;
    if (!bVar7) {
      iVar2 = tolower((int)*str1);
      iVar3 = tolower((int)*str2);
      if (iVar2 == iVar3) {
        uVar1 = 1;
        do {
          uVar6 = uVar1;
          if (sVar4 == uVar6) break;
          iVar2 = tolower((int)str1[uVar6]);
          iVar3 = tolower((int)str2[uVar6]);
          uVar1 = uVar6 + 1;
        } while (iVar2 == iVar3);
        bVar7 = sVar4 <= uVar6;
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool util::compareString(const char* str1, const char* str2){
    if(strlen(str1) != strlen(str2))
        return false;
    for(int i = 0; i < strlen(str1); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}